

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

Value * duckdb::DisabledCompressionMethodsSetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  DBConfig *pDVar1;
  _Base_ptr p_Var2;
  CompressionType extraout_DL;
  CompressionType type;
  CompressionType extraout_DL_00;
  CompressionType extraout_DL_01;
  string result;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  pDVar1 = DBConfig::GetConfig(context);
  local_90 = local_80;
  local_88 = 0;
  local_80[0] = 0;
  p_Var2 = (pDVar1->options).disabled_compression_methods._M_t._M_impl.super__Rb_tree_header.
           _M_header._M_left;
  type = extraout_DL;
  while ((_Rb_tree_header *)p_Var2 !=
         &(pDVar1->options).disabled_compression_methods._M_t._M_impl.super__Rb_tree_header) {
    if (local_88 != 0) {
      ::std::__cxx11::string::append((char *)&local_90);
      type = extraout_DL_00;
    }
    CompressionTypeToString_abi_cxx11_
              (&local_50,(duckdb *)(ulong)(byte)(char)p_Var2[1]._M_color,type);
    ::std::__cxx11::string::append((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_50);
    p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2);
    type = extraout_DL_01;
  }
  ::std::__cxx11::string::string((string *)&local_70,(string *)&local_90);
  Value::Value(__return_storage_ptr__,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

Value DisabledCompressionMethodsSetting::GetSetting(const ClientContext &context) {
	auto &config = DBConfig::GetConfig(context);
	string result;
	for (auto &optimizer : config.options.disabled_compression_methods) {
		if (!result.empty()) {
			result += ",";
		}
		result += CompressionTypeToString(optimizer);
	}
	return Value(result);
}